

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int cmocka_run_one_tests(CMUnitTestState *test_state)

{
  long lVar1;
  long lVar2;
  timespec clock0;
  int iVar3;
  ListNode *pLVar4;
  undefined8 *in_RDI;
  long *in_FS_OFFSET;
  double dVar5;
  int rc;
  timespec finish;
  timespec start;
  CMFixtureFunction in_stack_00000030;
  CMUnitTestFunction in_stack_00000038;
  char *in_stack_00000040;
  int local_34;
  __syscall_slong_t in_stack_ffffffffffffffd8;
  timespec in_stack_ffffffffffffffe0;
  
  lVar1 = in_FS_OFFSET[5];
  memset(&stack0xffffffffffffffe8,0,0x10);
  memset(&stack0xffffffffffffffd8,0,0x10);
  local_34 = 0;
  if (*(long *)(in_RDI[1] + 0x10) != 0) {
    pLVar4 = check_point_allocated_blocks();
    *in_RDI = pLVar4;
    local_34 = cmocka_run_one_test_or_fixture
                         (in_stack_00000040,in_stack_00000038,in_stack_00000030,
                          (CMFixtureFunction)start.tv_nsec,(void **)start.tv_sec,
                          (void *)finish.tv_nsec);
    if (local_34 != 0) {
      *(undefined4 *)(in_RDI + 4) = 3;
      cm_print_error();
    }
  }
  clock_gettime(0,(timespec *)&stack0xffffffffffffffe8);
  if (local_34 == 0) {
    iVar3 = cmocka_run_one_test_or_fixture
                      (in_stack_00000040,in_stack_00000038,in_stack_00000030,
                       (CMFixtureFunction)start.tv_nsec,(void **)start.tv_sec,(void *)finish.tv_nsec
                      );
    if (iVar3 == 0) {
      *(undefined4 *)(in_RDI + 4) = 1;
    }
    else if (global_skip_test == 0) {
      *(undefined4 *)(in_RDI + 4) = 2;
    }
    else {
      *(undefined4 *)(in_RDI + 4) = 4;
      global_skip_test = 0;
    }
    local_34 = 0;
  }
  in_RDI[5] = 0;
  clock_gettime(0,(timespec *)&stack0xffffffffffffffd8);
  clock0.tv_nsec = in_stack_ffffffffffffffd8;
  clock0.tv_sec = (__time_t)in_RDI;
  dVar5 = cm_secdiff(in_stack_ffffffffffffffe0,clock0);
  in_RDI[5] = dVar5;
  if (((local_34 == 0) && (*(long *)(in_RDI[1] + 0x18) != 0)) &&
     (local_34 = cmocka_run_one_test_or_fixture
                           (in_stack_00000040,in_stack_00000038,in_stack_00000030,
                            (CMFixtureFunction)start.tv_nsec,(void **)start.tv_sec,
                            (void *)finish.tv_nsec), local_34 != 0)) {
    *(undefined4 *)(in_RDI + 4) = 3;
    cm_print_error("Test teardown failed");
  }
  lVar2 = *in_FS_OFFSET;
  in_RDI[3] = *(undefined8 *)(lVar2 + -0x110);
  *(undefined8 *)(lVar2 + -0x110) = 0;
  if (in_FS_OFFSET[5] != lVar1) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

static int cmocka_run_one_tests(struct CMUnitTestState *test_state)
{
#ifdef HAVE_STRUCT_TIMESPEC
    struct timespec start = {
        .tv_sec = 0,
        .tv_nsec = 0,
    };
    struct timespec finish = {
        .tv_sec = 0,
        .tv_nsec = 0,
    };
#endif
    int rc = 0;

    /* Run setup */
    if (test_state->test->setup_func != NULL) {
        /* Setup the memory check point, it will be evaluated on teardown */
        test_state->check_point = check_point_allocated_blocks();

        rc = cmocka_run_one_test_or_fixture(test_state->test->name,
                                            NULL,
                                            test_state->test->setup_func,
                                            NULL,
                                            &test_state->state,
                                            test_state->check_point);
        if (rc != 0) {
            test_state->status = CM_TEST_ERROR;
            cm_print_error("Test setup failed");
        }
    }

    /* Run test */
#ifdef HAVE_STRUCT_TIMESPEC
    CMOCKA_CLOCK_GETTIME(CLOCK_REALTIME, &start);
#endif

    if (rc == 0) {
        rc = cmocka_run_one_test_or_fixture(test_state->test->name,
                                            test_state->test->test_func,
                                            NULL,
                                            NULL,
                                            &test_state->state,
                                            NULL);
        if (rc == 0) {
            test_state->status = CM_TEST_PASSED;
        } else {
            if (global_skip_test) {
                test_state->status = CM_TEST_SKIPPED;
                global_skip_test = 0; /* Do not skip the next test */
            } else {
                test_state->status = CM_TEST_FAILED;
            }
        }
        rc = 0;
    }

    test_state->runtime = 0.0;

#ifdef HAVE_STRUCT_TIMESPEC
    CMOCKA_CLOCK_GETTIME(CLOCK_REALTIME, &finish);
    test_state->runtime = cm_secdiff(finish, start);
#endif

    /* Run teardown */
    if (rc == 0 && test_state->test->teardown_func != NULL) {
        rc = cmocka_run_one_test_or_fixture(test_state->test->name,
                                            NULL,
                                            NULL,
                                            test_state->test->teardown_func,
                                            &test_state->state,
                                            test_state->check_point);
        if (rc != 0) {
            test_state->status = CM_TEST_ERROR;
            cm_print_error("Test teardown failed");
        }
    }

    test_state->error_message = cm_error_message;
    cm_error_message = NULL;

    return rc;
}